

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1eab::DataDump<long_double>::~DataDump(DataDump<long_double> *this)

{
  ~DataDump(this);
  operator_delete(this);
  return;
}

Assistant:

~DataDump() override {
  }